

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::Deferred<Fixpp::ErrorKind>::
construct<Fixpp::ErrorKind::Type&,unsigned_long&,std::__cxx11::string>
          (Deferred<Fixpp::ErrorKind> *this,Type *args,unsigned_long *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  Type type;
  size_t column;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  unsigned_long *args_local_1;
  Type *args_local;
  Deferred<Fixpp::ErrorKind> *this_local;
  
  type = *args;
  column = *args_1;
  local_28 = args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (unsigned_long *)args;
  args_local = (Type *)this;
  std::__cxx11::string::string((string *)&local_48,args_2);
  ErrorKind::ErrorKind((ErrorKind *)this,type,column,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this->empty_ = false;
  return;
}

Assistant:

void construct(Args&& ...args)
        {
            new (&storage_) T(std::forward<Args>(args)...);
            empty_ = false;
        }